

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_array_2_d.cxx
# Opt level: O3

void __thiscall BooleanArray2D::BooleanArray2D(BooleanArray2D *this,uint rows,uint cols)

{
  uchar *puVar1;
  logic_error *this_00;
  double dVar2;
  
  this->rows = rows;
  this->cols = cols;
  if (rows == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Rows must be bigger than 0.");
  }
  else {
    if (cols != 0) {
      dVar2 = ceil((double)(cols * rows) * 0.125);
      puVar1 = (uchar *)operator_new__((ulong)(uint)((int)(long)dVar2 << 3));
      this->data = puVar1;
      return;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Columns must be bigger than 0.");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BooleanArray2D::BooleanArray2D(unsigned int rows, unsigned int cols)
    : rows(rows), cols(cols)
{
    if(rows == 0) {
        throw std::logic_error("Rows must be bigger than 0.");
    }
    if(cols == 0) {
        throw std::logic_error("Columns must be bigger than 0.");
    }

    unsigned int size = 8 * (unsigned int) ceil((float) (rows * cols) / 8.0);
    data = new unsigned char[size];
}